

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

ReturnType __thiscall r_comp::Preprocessor::getReturnType(Preprocessor *this,Ptr *s)

{
  bool bVar1;
  element_type *peVar2;
  Ptr *s_local;
  Preprocessor *this_local;
  
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  bVar1 = std::operator==(&peVar2->tail,":nb");
  if (bVar1) {
    this_local._4_4_ = NUMBER;
  }
  else {
    peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)s);
    bVar1 = std::operator==(&peVar2->tail,":us");
    if (bVar1) {
      this_local._4_4_ = TIMESTAMP;
    }
    else {
      peVar2 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)s);
      bVar1 = std::operator==(&peVar2->tail,":bl");
      if (bVar1) {
        this_local._4_4_ = BOOLEAN;
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)s);
        bVar1 = std::operator==(&peVar2->tail,":st");
        if (bVar1) {
          this_local._4_4_ = STRING;
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)s);
          bVar1 = std::operator==(&peVar2->tail,":nid");
          if (bVar1) {
            this_local._4_4_ = NODE_ID;
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)s);
            bVar1 = std::operator==(&peVar2->tail,":did");
            if (bVar1) {
              this_local._4_4_ = DEVICE_ID;
            }
            else {
              peVar2 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)s);
              bVar1 = std::operator==(&peVar2->tail,":fid");
              if (bVar1) {
                this_local._4_4_ = FUNCTION_ID;
              }
              else {
                peVar2 = std::
                         __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)s);
                bVar1 = std::operator==(&peVar2->tail,":[]");
                if (bVar1) {
                  this_local._4_4_ = SET;
                }
                else {
                  this_local._4_4_ = ANY;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

ReturnType Preprocessor::getReturnType(RepliStruct::Ptr s)
{
    if (s->tail == ":nb") {
        return NUMBER;
    } else if (s->tail == ":us") {
        return TIMESTAMP;
    } else if (s->tail == ":bl") {
        return BOOLEAN;
    } else if (s->tail == ":st") {
        return STRING;
    } else if (s->tail == ":nid") {
        return NODE_ID;
    } else if (s->tail == ":did") {
        return DEVICE_ID;
    } else if (s->tail == ":fid") {
        return FUNCTION_ID;
    } else if (s->tail == ":[]") {
        return SET;
    }

    return ANY;
}